

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall cppcms::application::attach(application *this,application *app)

{
  pointer *pppaVar1;
  _data *p_Var2;
  iterator __position;
  application *paVar3;
  application *local_10;
  
  p_Var2 = (this->d).ptr_;
  __position._M_current =
       (p_Var2->managed_children).
       super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = app;
  if (__position._M_current ==
      (p_Var2->managed_children).
      super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cppcms::application*,std::allocator<cppcms::application*>>::
    _M_realloc_insert<cppcms::application*const&>
              ((vector<cppcms::application*,std::allocator<cppcms::application*>> *)
               &p_Var2->managed_children,__position,&local_10);
  }
  else {
    *__position._M_current = app;
    pppaVar1 = &(p_Var2->managed_children).
                super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  if (local_10->parent_ != this) {
    local_10->parent_ = this;
    paVar3 = this->root_;
    if (paVar3 != paVar3->root_) {
      do {
        paVar3 = paVar3->root_;
        this->root_ = paVar3;
      } while (paVar3->root_ != paVar3);
    }
    local_10->root_ = paVar3;
  }
  return;
}

Assistant:

void application::attach(application *app)
{
	d->managed_children.push_back(app);
	add(*app);
}